

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O3

string * __thiscall
Shell::resultToString_abi_cxx11_(string *__return_storage_ptr__,Shell *this,ActionResult *result)

{
  char *pcVar1;
  char *pcVar2;
  undefined1 local_1d8 [8];
  stringstream ss;
  ostream local_1c8 [112];
  ios_base local_158 [264];
  SmallVector<wasm::Literal,_1UL> local_50;
  
  switch((result->
         super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
         ).
         super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
         .
         super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
         .
         super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
         .
         super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
         .
         super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
         ._M_index) {
  case '\0':
    std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
    wasm::SmallVector<wasm::Literal,_1UL>::SmallVector
              (&local_50,(SmallVector<wasm::Literal,_1UL> *)result);
    wasm::operator<<(local_1c8,(Literals)_local_1d8);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_50.flexible);
    wasm::Literal::~Literal(local_50.fixed._M_elems);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1d8);
    std::ios_base::~ios_base(local_158);
    return __return_storage_ptr__;
  case '\x01':
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "trap";
    pcVar1 = "";
    break;
  case '\x02':
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "exceeded host limit";
    pcVar1 = "";
    break;
  case '\x03':
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "exception";
    pcVar1 = "";
    break;
  default:
    wasm::handle_unreachable
              ("unexpected result",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp"
               ,0xcc);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string resultToString(ActionResult& result) {
    if (std::get_if<TrapResult>(&result)) {
      return "trap";
    } else if (std::get_if<HostLimitResult>(&result)) {
      return "exceeded host limit";
    } else if (std::get_if<ExceptionResult>(&result)) {
      return "exception";
    } else if (auto* vals = std::get_if<Literals>(&result)) {
      std::stringstream ss;
      ss << *vals;
      return ss.str();
    } else {
      WASM_UNREACHABLE("unexpected result");
    }
  }